

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPathSeparator.h
# Opt level: O2

void __thiscall
HighsPathSeparator::HighsPathSeparator(HighsPathSeparator *this,HighsMipSolver *mipsolver)

{
  HighsSeparator::HighsSeparator(&this->super_HighsSeparator,mipsolver,"PathAggr sepa");
  (this->super_HighsSeparator)._vptr_HighsSeparator = (_func_int **)&PTR_separateLpSolution_004331a0
  ;
  HighsRandom::initialise(&this->randgen,0);
  HighsRandom::initialise
            (&this->randgen,(mipsolver->options_mip_->super_HighsOptionsStruct).random_seed);
  return;
}

Assistant:

HighsPathSeparator(const HighsMipSolver& mipsolver)
      : HighsSeparator(mipsolver, "PathAggr sepa") {
    randgen.initialise(mipsolver.options_mip_->random_seed);
  }